

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmd.c
# Opt level: O0

int slu_mmdnum_(int *neqns,int *perm,int *invp,shortint *qsize)

{
  int iVar1;
  int iVar2;
  int_t iVar3;
  int_t num;
  int_t nqsize;
  int_t father;
  int_t nextf;
  int_t root;
  int_t node;
  int i__1;
  shortint *qsize_local;
  int *invp_local;
  int *perm_local;
  int *neqns_local;
  
  iVar1 = *neqns;
  for (nextf = 1; nextf <= iVar1; nextf = nextf + 1) {
    if (qsize[(long)nextf + -1] < 1) {
      perm[(long)nextf + -1] = invp[(long)nextf + -1];
    }
    else {
      perm[(long)nextf + -1] = -invp[(long)nextf + -1];
    }
  }
  iVar1 = *neqns;
  for (nextf = 1; nextf <= iVar1; nextf = nextf + 1) {
    if (perm[(long)nextf + -1] < 1) {
      num = nextf;
      while (iVar3 = num, perm[(long)num + -1] < 1) {
        num = -perm[(long)num + -1];
      }
      iVar2 = perm[(long)num + -1];
      invp[(long)nextf + -1] = -(iVar2 + 1);
      perm[(long)num + -1] = iVar2 + 1;
      num = nextf;
      while (iVar2 = perm[(long)num + -1], iVar2 < 0) {
        perm[(long)num + -1] = -iVar3;
        num = -iVar2;
      }
    }
  }
  iVar1 = *neqns;
  for (nextf = 1; nextf <= iVar1; nextf = nextf + 1) {
    iVar2 = invp[(long)nextf + -1];
    invp[(long)nextf + -1] = -iVar2;
    perm[(long)-iVar2 + -1] = nextf;
  }
  return 0;
}

Assistant:

int slu_mmdnum_(const int *neqns, int *perm, int *invp, shortint *qsize)
{
    /* System generated locals */

    int i__1;

    /* Local variables */
    int_t node, root, nextf, father, nqsize, num;


/* *************************************************************** */


/* *************************************************************** */

    /* Parameter adjustments */
    --qsize;
    --invp;
    --perm;

    /* Function Body */
    i__1 = *neqns;
    for (node = 1; node <= i__1; ++node) {
	nqsize = qsize[node];
	if (nqsize <= 0) {
	    perm[node] = invp[node];
	}
	if (nqsize > 0) {
	    perm[node] = -invp[node];
	}
/* L100: */
    }
/*        ------------------------------------------------------ */
/*        FOR EACH NODE WHICH HAS BEEN MERGED, DO THE FOLLOWING. */
/*        ------------------------------------------------------ */
    i__1 = *neqns;
    for (node = 1; node <= i__1; ++node) {
	if (perm[node] > 0) {
	    goto L500;
	}
/*                ----------------------------------------- */
/*                TRACE THE MERGED TREE UNTIL ONE WHICH HAS */
/*                NOT BEEN MERGED, CALL IT ROOT. */
/*                ----------------------------------------- */
	father = node;
L200:
	if (perm[father] > 0) {
	    goto L300;
	}
	father = -perm[father];
	goto L200;
L300:
/*                ----------------------- */
/*                NUMBER NODE AFTER ROOT. */
/*                ----------------------- */
	root = father;
	num = perm[root] + 1;
	invp[node] = -num;
	perm[root] = num;
/*                ------------------------ */
/*                SHORTEN THE MERGED TREE. */
/*                ------------------------ */
	father = node;
L400:
	nextf = -perm[father];
	if (nextf <= 0) {
	    goto L500;
	}
	perm[father] = -root;
	father = nextf;
	goto L400;
L500:
	;
    }
/*        ---------------------- */
/*        READY TO COMPUTE PERM. */
/*        ---------------------- */
    i__1 = *neqns;
    for (node = 1; node <= i__1; ++node) {
	num = -invp[node];
	invp[node] = num;
	perm[num] = node;
/* L600: */
    }
    return 0;

}